

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O3

void __thiscall
CDoodadsMapper::PlaceDoodads
          (CDoodadsMapper *this,CLayerTiles *pLayer,CRule *pRule,
          array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
          *pPositions,int Amount,int LeftWall)

{
  int *piVar1;
  uchar *puVar2;
  CTile CVar3;
  CTile *pCVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  array<int,_allocator_default<int>_> *paVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  char cVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  long in_FS_OFFSET;
  array<int,_allocator_default<int>_> local_58;
  array<int,_allocator_default<int>_> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pRule->m_Location == 1) {
    lVar7 = 0x14;
  }
  else {
    if (pRule->m_Location != 2) goto LAB_0018fc22;
    lVar7 = 0x10;
  }
  piVar1 = (int *)((long)&(pRule->m_Rect).field_0 + lVar7);
  *piVar1 = *piVar1 + 1;
LAB_0018fc22:
  if (LeftWall != 0) {
    pRule->m_HFlip = pRule->m_HFlip ^ LeftWall;
    (pRule->m_RelativePos).field_0.x =
         2 - ((pRule->m_RelativePos).field_0.x + (pRule->m_Size).field_0.x);
  }
  iVar19 = pRule->m_Random;
  uVar9 = (uint)(((101.0 - (float)Amount) / 100.0) * (float)iVar19);
  if (iVar19 == 1) {
    uVar9 = 1;
  }
  uVar12 = 2;
  if (2 < (int)uVar9) {
    uVar12 = uVar9;
  }
  if (iVar19 < 2) {
    uVar12 = uVar9;
  }
  iVar19 = pPositions->num_elements;
  if (0 < iVar19) {
    iVar14 = pLayer->m_Height * pLayer->m_Width;
    paVar8 = pPositions->list;
    lVar7 = 0;
    do {
      iVar13 = paVar8[lVar7].num_elements;
      if (0 < iVar13) {
        uVar9 = 0;
        do {
          if ((uint)pRule->m_Location < 2) {
            if ((int)(iVar13 - uVar9) < (pRule->m_Size).field_0.x) break;
          }
          else if ((pRule->m_Location == 2) && ((int)(iVar13 - uVar9) < (pRule->m_Size).field_1.y))
          break;
          if ((int)uVar12 < 2) {
LAB_0018fd26:
            iVar19 = (pRule->m_Size).field_1.y;
            iVar13 = paVar8[lVar7].list[(int)uVar9] + (pRule->m_RelativePos).field_0.x;
            uVar5 = pLayer->m_Width;
            iVar15 = (pRule->m_RelativePos).field_1.y * uVar5;
            uVar6 = iVar13 + iVar15;
            if (0 < iVar19) {
              iVar16 = (pRule->m_Size).field_0.x;
              uVar17 = (ulong)uVar6;
              cVar18 = '\0';
              lVar21 = 0;
              do {
                if (0 < iVar16) {
                  lVar11 = 0;
                  do {
                    iVar19 = (int)(uVar17 + lVar11);
                    if (iVar19 < iVar14 && 0 < iVar19) {
                      pLayer->m_pTiles[uVar17 + lVar11 & 0xffffffff].m_Index =
                           cVar18 + (char)lVar11 + (char)(pRule->m_Rect).field_0.x;
                      iVar16 = (pRule->m_Size).field_0.x;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < iVar16);
                  iVar19 = (pRule->m_Size).field_1.y;
                }
                lVar21 = lVar21 + 1;
                uVar17 = uVar17 + uVar5;
                cVar18 = cVar18 + '\x10';
              } while (lVar21 < iVar19);
            }
            if (0 < iVar19 && pRule->m_HFlip != 0) {
              uVar5 = (pRule->m_Size).field_0.x;
              uVar17 = (ulong)uVar5;
              iVar16 = 0;
              do {
                if (1 < (int)uVar5) {
                  iVar10 = 0;
                  iVar19 = iVar13 + iVar15;
                  do {
                    iVar19 = iVar19 + -1;
                    iVar22 = pLayer->m_Width * iVar16;
                    uVar20 = uVar6 + iVar10 + iVar22;
                    if (((int)uVar20 < iVar14 && 0 < (int)uVar20) &&
                       (uVar5 = uVar5 + iVar19 + iVar22, (int)uVar5 < iVar14 && 0 < (int)uVar5)) {
                      pCVar4 = pLayer->m_pTiles;
                      CVar3 = pCVar4[uVar20];
                      pCVar4[uVar20] = pCVar4[uVar5];
                      pLayer->m_pTiles[uVar5] = CVar3;
                      uVar17 = (ulong)(uint)(pRule->m_Size).field_0.x;
                    }
                    iVar10 = iVar10 + 1;
                    uVar5 = (uint)uVar17;
                  } while (iVar10 < (int)((int)(uVar17 >> 0x1f) + uVar5) >> 1);
                  iVar19 = (pRule->m_Size).field_1.y;
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 < iVar19);
              if (0 < iVar19) {
                iVar13 = (pRule->m_Size).field_0.x;
                iVar15 = 0;
                do {
                  if (0 < iVar13) {
                    iVar19 = pLayer->m_Width;
                    lVar21 = 0;
                    do {
                      uVar17 = (ulong)(iVar19 * iVar15 + uVar6) + lVar21;
                      iVar16 = (int)uVar17;
                      if (iVar16 < iVar14 && 0 < iVar16) {
                        puVar2 = &pLayer->m_pTiles[uVar17 & 0xffffffff].m_Flags;
                        *puVar2 = *puVar2 ^ 1;
                        iVar13 = (pRule->m_Size).field_0.x;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < iVar13);
                    iVar19 = (pRule->m_Size).field_1.y;
                  }
                  iVar15 = iVar15 + 1;
                } while (iVar15 < iVar19);
              }
            }
            if (pRule->m_VFlip != 0) {
              if (1 < iVar19) {
                iVar13 = (pRule->m_Size).field_0.x;
                iVar15 = 0;
                iVar16 = -1;
                do {
                  if (0 < iVar13) {
                    iVar19 = 0;
                    do {
                      uVar5 = iVar15 * pLayer->m_Width + uVar6 + iVar19;
                      if (((int)uVar5 < iVar14 && 0 < (int)uVar5) &&
                         (uVar20 = uVar6 + iVar19 +
                                   pLayer->m_Width * ((pRule->m_Size).field_1.y + iVar16),
                         (int)uVar20 < iVar14 && 0 < (int)uVar20)) {
                        pCVar4 = pLayer->m_pTiles;
                        CVar3 = pCVar4[uVar5];
                        pCVar4[uVar5] = pCVar4[uVar20];
                        pLayer->m_pTiles[uVar20] = CVar3;
                        iVar13 = (pRule->m_Size).field_0.x;
                      }
                      iVar19 = iVar19 + 1;
                    } while (iVar19 < iVar13);
                    iVar19 = (pRule->m_Size).field_1.y;
                  }
                  iVar15 = iVar15 + 1;
                  iVar16 = iVar16 + -1;
                } while (iVar15 < iVar19 / 2);
              }
              if (0 < iVar19) {
                iVar13 = (pRule->m_Size).field_0.x;
                iVar15 = 0;
                do {
                  if (0 < iVar13) {
                    iVar19 = pLayer->m_Width;
                    lVar21 = 0;
                    do {
                      uVar17 = (ulong)(iVar19 * iVar15 + uVar6) + lVar21;
                      iVar16 = (int)uVar17;
                      if (iVar16 < iVar14 && 0 < iVar16) {
                        puVar2 = &pLayer->m_pTiles[uVar17 & 0xffffffff].m_Flags;
                        *puVar2 = *puVar2 ^ 2;
                        iVar13 = (pRule->m_Size).field_0.x;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < iVar13);
                    iVar19 = (pRule->m_Size).field_1.y;
                  }
                  iVar15 = iVar15 + 1;
                } while (iVar15 < iVar19);
              }
            }
            if (1 < (int)uVar12) {
              local_48.list_size = 1;
              local_48.list = (int *)operator_new__(4);
              local_48.num_elements = 0;
              local_58.list_size = 1;
              local_58.list = (int *)operator_new__(4);
              local_58.num_elements = 0;
              if (0 < (int)uVar9) {
                lVar21 = 0;
                do {
                  array<int,_allocator_default<int>_>::add
                            (&local_48,(int *)((long)pPositions->list[lVar7].list + lVar21));
                  lVar21 = lVar21 + 4;
                } while ((ulong)uVar9 << 2 != lVar21);
              }
              iVar19 = (&(pRule->m_Size).field_0)[pRule->m_Location == 2].x;
              paVar8 = pPositions->list;
              if ((int)(uVar9 + iVar19) < paVar8[lVar7].num_elements) {
                lVar11 = (long)(int)uVar9 + (long)iVar19;
                lVar21 = lVar11 * 4;
                do {
                  array<int,_allocator_default<int>_>::add
                            (&local_58,(int *)((long)paVar8[lVar7].list + lVar21));
                  lVar11 = lVar11 + 1;
                  paVar8 = pPositions->list;
                  lVar21 = lVar21 + 4;
                } while (lVar11 < paVar8[lVar7].num_elements);
              }
              array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
              ::remove_index(pPositions,(int)lVar7);
              if (1 < local_48.num_elements) {
                array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                ::add(pPositions,&local_48);
              }
              if (1 < local_58.num_elements) {
                array<array<int,_allocator_default<int>_>,_allocator_default<array<int,_allocator_default<int>_>_>_>
                ::add(pPositions,&local_58);
              }
              if (local_58.list != (int *)0x0) {
                operator_delete__(local_58.list);
              }
              if (local_48.list != (int *)0x0) {
                operator_delete__(local_48.list);
              }
              uVar9 = 0xffffffff;
            }
          }
          else {
            uVar5 = rand();
            uVar6 = rand();
            if (((uVar5 & 0x7fff) << 0x10 | uVar6 & 0xffff) % uVar12 == 0) {
              paVar8 = pPositions->list;
              goto LAB_0018fd26;
            }
          }
          uVar9 = uVar9 + (pRule->m_Size).field_0.x;
          paVar8 = pPositions->list;
          iVar13 = paVar8[lVar7].num_elements;
        } while ((int)uVar9 < iVar13);
        iVar19 = pPositions->num_elements;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar19);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CDoodadsMapper::PlaceDoodads(CLayerTiles *pLayer, CRule *pRule, array<array<int> > *pPositions, int Amount, int LeftWall)
{
	if(pRule->m_Location == CRule::CEILING)
		pRule->m_RelativePos.y++;
	else if(pRule->m_Location == CRule::WALLS)
		pRule->m_RelativePos.x++;

	// left walls
	if(LeftWall)
	{
		pRule->m_HFlip ^= LeftWall;
		pRule->m_RelativePos.x--;
		pRule->m_RelativePos.x = -pRule->m_RelativePos.x;
		pRule->m_RelativePos.x -= pRule->m_Size.x-1;
	}

	int MaxIndex = pLayer->m_Width*pLayer->m_Height;
	int RandomValue = pRule->m_Random*((101.f-Amount)/100.0f);

	if(pRule->m_Random == 1)
		RandomValue = 1;

	// allow diversity with high Amount
	if(pRule->m_Random > 1 && RandomValue <= 1)
		RandomValue = 2;

	for(int f = 0; f < pPositions->size(); f++)
		for(int c = 0; c < (*pPositions)[f].size(); c += pRule->m_Size.x)
		{
			if((pRule->m_Location == CRule::FLOOR || pRule->m_Location == CRule::CEILING)
				&& (*pPositions)[f].size()-c < pRule->m_Size.x)
			break;

			if(pRule->m_Location == CRule::WALLS && (*pPositions)[f].size()-c < pRule->m_Size.y)
				break;

			if(RandomValue > 1 && !IAutoMapper::Random(RandomValue))
				continue;

			// where to put it
			int ID = (*pPositions)[f][c];

			// relative position
			ID += pRule->m_RelativePos.x;
			ID += pRule->m_RelativePos.y*pLayer->m_Width;

			for(int y = 0; y < pRule->m_Size.y; y++)
				for(int x = 0; x < pRule->m_Size.x; x++)
				{
					int Index = y*pLayer->m_Width+x+ID;
					if(Index <= 0 || Index >= MaxIndex)
						continue;

					pLayer->m_pTiles[Index].m_Index = pRule->m_Rect.x+y*16+x;
				}

			// hflip
			if(pRule->m_HFlip)
			{
				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x/2; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+pRule->m_Size.x-1-x*2;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_VFLIP;
					}
			}

			// vflip
			if(pRule->m_VFlip)
			{
				for(int y = 0; y < pRule->m_Size.y/2; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						int CheckIndex = Index+(pRule->m_Size.y-1-y*2)*pLayer->m_Width;

						if(CheckIndex <= 0 || CheckIndex >= MaxIndex)
							continue;

						CTile Tmp = pLayer->m_pTiles[Index];
						pLayer->m_pTiles[Index] = pLayer->m_pTiles[CheckIndex];
						pLayer->m_pTiles[CheckIndex] = Tmp;
					}

				for(int y = 0; y < pRule->m_Size.y; y++)
					for(int x = 0; x < pRule->m_Size.x; x++)
					{
						int Index = y*pLayer->m_Width+x+ID;
						if(Index <= 0 || Index >= MaxIndex)
							continue;

						pLayer->m_pTiles[Index].m_Flags ^= TILEFLAG_HFLIP;
					}
			}

			// make the place occupied
			if(RandomValue > 1)
			{
				array<int> aChainBefore;
				array<int> aChainAfter;

				for(int j = 0; j < c; j++)
					aChainBefore.add((*pPositions)[f][j]);

				int Size = pRule->m_Size.x;
				if(pRule->m_Location == CRule::WALLS)
					Size = pRule->m_Size.y;

				for(int j = c+Size; j < (*pPositions)[f].size(); j++)
					aChainAfter.add((*pPositions)[f][j]);

				pPositions->remove_index(f);

				// f changes, reset c
				c = -1;

				if(aChainBefore.size() > 1)
					pPositions->add(aChainBefore);
				if(aChainAfter.size() > 1)
					pPositions->add(aChainAfter);
			}
		}
}